

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

Cord * __thiscall absl::lts_20240722::Cord::operator=(Cord *this,string_view src)

{
  bool bVar1;
  const_pointer data_00;
  size_type length_00;
  Nullable<absl::cord_internal::CordzInfo_*> pCVar2;
  CordRepFlat *pCVar3;
  size_t sVar4;
  char *__dest;
  Nullable<CordRep_*> pCVar5;
  CordzUpdateScope local_58;
  CordzUpdateScope scope;
  CordRep *tree;
  size_t length;
  char *data;
  MethodIdentifier method;
  Cord *this_local;
  string_view src_local;
  
  src_local._M_len = (size_t)src._M_str;
  this_local = (Cord *)src._M_len;
  data_00 = std::basic_string_view<char,_std::char_traits<char>_>::data
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  length_00 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  scope.info_ = (CordzInfo *)InlineRep::tree(&this->contents_);
  if (length_00 < 0x10) {
    if (((Nullable<absl::cord_internal::CordRep_*>)scope.info_ !=
         (Nullable<absl::cord_internal::CordRep_*>)0x0) &&
       (pCVar2 = InlineRep::cordz_info(&this->contents_),
       pCVar2 != (Nullable<absl::cord_internal::CordzInfo_*>)0x0)) {
      absl::lts_20240722::cord_internal::CordzInfo::Untrack();
    }
    InlineRep::set_data(&this->contents_,data_00,length_00);
    if (scope.info_ != (CordzInfo *)0x0) {
      cord_internal::CordRep::Unref((CordRep *)scope.info_);
      return this;
    }
    return this;
  }
  if ((Nullable<absl::cord_internal::CordRep_*>)scope.info_ ==
      (Nullable<absl::cord_internal::CordRep_*>)0x0) {
    pCVar5 = NewTree(data_00,length_00,0);
    InlineRep::EmplaceTree(&this->contents_,pCVar5,kAssignString);
    return this;
  }
  pCVar2 = InlineRep::cordz_info(&this->contents_);
  cord_internal::CordzUpdateScope::CordzUpdateScope(&local_58,pCVar2,kAssignString);
  bVar1 = cord_internal::CordRep::IsFlat((CordRep *)scope.info_);
  if (bVar1) {
    pCVar3 = cord_internal::CordRep::flat((CordRep *)scope.info_);
    sVar4 = cord_internal::CordRepFlat::Capacity(pCVar3);
    if ((length_00 <= sVar4) &&
       (bVar1 = cord_internal::RefcountAndFlags::IsOne((RefcountAndFlags *)(scope.info_ + 8)), bVar1
       )) {
      pCVar3 = cord_internal::CordRep::flat((CordRep *)scope.info_);
      __dest = cord_internal::CordRepFlat::Data(pCVar3);
      memmove(__dest,data_00,length_00);
      *(size_type *)scope.info_ = length_00;
      VerifyTree((Nullable<CordRep_*>)scope.info_);
      bVar1 = true;
      src_local._M_str = (char *)this;
      goto LAB_00126450;
    }
  }
  pCVar5 = NewTree(data_00,length_00,0);
  InlineRep::SetTree(&this->contents_,pCVar5,&local_58);
  cord_internal::CordRep::Unref((CordRep *)scope.info_);
  bVar1 = false;
LAB_00126450:
  cord_internal::CordzUpdateScope::~CordzUpdateScope(&local_58);
  if (!bVar1) {
    return this;
  }
  return (Cord *)src_local._M_str;
}

Assistant:

Cord& Cord::operator=(absl::string_view src) {
  auto constexpr method = CordzUpdateTracker::kAssignString;
  const char* data = src.data();
  size_t length = src.size();
  CordRep* tree = contents_.tree();
  if (length <= InlineRep::kMaxInline) {
    // Embed into this->contents_, which is somewhat subtle:
    // - MaybeUntrackCord must be called before Unref(tree).
    // - MaybeUntrackCord must be called before set_data() clobbers cordz_info.
    // - set_data() must be called before Unref(tree) as it may reference tree.
    if (tree != nullptr) CordzInfo::MaybeUntrackCord(contents_.cordz_info());
    contents_.set_data(data, length);
    if (tree != nullptr) CordRep::Unref(tree);
    return *this;
  }
  if (tree != nullptr) {
    CordzUpdateScope scope(contents_.cordz_info(), method);
    if (tree->IsFlat() && tree->flat()->Capacity() >= length &&
        tree->refcount.IsOne()) {
      // Copy in place if the existing FLAT node is reusable.
      memmove(tree->flat()->Data(), data, length);
      tree->length = length;
      VerifyTree(tree);
      return *this;
    }
    contents_.SetTree(NewTree(data, length, 0), scope);
    CordRep::Unref(tree);
  } else {
    contents_.EmplaceTree(NewTree(data, length, 0), method);
  }
  return *this;
}